

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

void __thiscall cs_impl::any::detach(any *this)

{
  proxy *ppVar1;
  error *this_00;
  string local_38;
  
  ppVar1 = this->mDat;
  if (ppVar1 == (proxy *)0x0) {
    return;
  }
  if (ppVar1->protect_level < 3) {
    (*ppVar1->data->_vptr_baseHolder[8])();
    return;
  }
  this_00 = (error *)__cxa_allocate_exception(0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"E000L","");
  cov::error::error(this_00,&local_38);
  __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
}

Assistant:

void detach() const
		{
			if (this->mDat != nullptr) {
				if (this->mDat->protect_level > 2)
					throw cov::error("E000L");
				this->mDat->data->detach();
			}
		}